

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tankmixmodel.cpp
# Opt level: O0

double __thiscall
TankMixModel::findFIFOQuality(TankMixModel *this,double vNet,double vIn,double wIn,SegPool *segPool)

{
  Segment *seg_00;
  SystemError *this_00;
  double *pdVar1;
  double extraout_XMM0_Qa;
  Segment *local_78;
  double vSeg;
  Segment *seg_1;
  double vOut;
  double wSum;
  double vSum;
  Segment *local_40;
  Segment *seg;
  double cIn;
  SegPool *segPool_local;
  double wIn_local;
  double vIn_local;
  double vNet_local;
  TankMixModel *this_local;
  
  cIn = (double)segPool;
  segPool_local = (SegPool *)wIn;
  wIn_local = vIn;
  vIn_local = vNet;
  vNet_local = (double)this;
  if (0.0 < vIn) {
    seg = (Segment *)(wIn / vIn);
    if ((this->lastSeg == (Segment *)0x0) || (std::abs((int)this), this->cTol <= extraout_XMM0_Qa))
    {
      local_40 = SegPool::getSegment((SegPool *)cIn,wIn_local,(double)seg);
      if (local_40 == (Segment *)0x0) {
        this_00 = (SystemError *)__cxa_allocate_exception(0x30);
        SystemError::SystemError(this_00,0);
        __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
      }
      if (this->firstSeg == (Segment *)0x0) {
        this->firstSeg = local_40;
      }
      if (this->lastSeg != (Segment *)0x0) {
        this->lastSeg->next = local_40;
      }
      this->lastSeg = local_40;
    }
    else {
      this->lastSeg->v = wIn_local + this->lastSeg->v;
    }
  }
  wSum = 0.0;
  vOut = 0.0;
  seg_1 = (Segment *)(wIn_local - vIn_local);
  while ((0.0 < (double)seg_1 && (seg_00 = this->firstSeg, seg_00 != (Segment *)0x0))) {
    pdVar1 = std::min<double>(&seg_00->v,(double *)&seg_1);
    local_78 = (Segment *)*pdVar1;
    if (seg_00 == this->lastSeg) {
      local_78 = seg_1;
    }
    wSum = (double)local_78 + wSum;
    vOut = seg_00->c * (double)local_78 + vOut;
    seg_1 = (Segment *)((double)seg_1 - (double)local_78);
    if ((((double)seg_1 < 0.0) || ((double)local_78 < seg_00->v)) ||
       (seg_00->next == (Segment *)0x0)) {
      seg_00->v = seg_00->v - (double)local_78;
    }
    else {
      this->firstSeg = seg_00->next;
      SegPool::freeSegment((SegPool *)cIn,seg_00);
    }
  }
  if (wSum <= 0.0) {
    if (this->firstSeg == (Segment *)0x0) {
      this->cTank = 0.0;
    }
    else {
      this->cTank = this->firstSeg->c;
    }
  }
  else {
    this->cTank = vOut / wSum;
  }
  return this->cTank;
}

Assistant:

double TankMixModel::findFIFOQuality(double vNet, double vIn, double wIn,
                                     SegPool* segPool)
{
    // ... add new last segment for flow entering the tank
    if ( vIn > 0.0 )
    {
        // ... increase segment volume if inflow has same quality as segment
        double cIn = wIn / vIn;
        if ( lastSeg && abs(lastSeg->c - cIn ) < cTol ) lastSeg->v += vIn;

        // ... otherwise add a new last segment to the tank
        else
        {
            Segment* seg = segPool->getSegment(vIn, cIn);
            if ( seg == nullptr ) throw SystemError(SystemError::OUT_OF_MEMORY);
            if ( firstSeg == nullptr ) firstSeg = seg;
            if ( lastSeg ) lastSeg->next = seg;
            lastSeg = seg;
        }
    }

    // ... withdraw flow from first segment
    double vSum = 0.0;
    double wSum = 0.0;
    double vOut = vIn - vNet;
    while (vOut > 0.0)
    {
        Segment* seg = firstSeg;
        if ( seg == nullptr ) break;
        double vSeg = min(seg->v, vOut);
        if ( seg == lastSeg ) vSeg = vOut;
        vSum += vSeg;
        wSum += seg->c * vSeg;
        vOut -= vSeg;
        if ( vOut >= 0.0 && vSeg >= seg->v && seg->next )
        {
            firstSeg = seg->next;
            segPool->freeSegment(seg);
        }
        else seg->v -= vSeg;
    }

    // ... return average quality withdrawn from 1st segment
    if ( vSum > 0.0 ) cTank = wSum / vSum;
    else if ( firstSeg == nullptr ) cTank = 0.0;
    else  cTank = firstSeg->c;
    return cTank;
}